

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationPrimitiveDiscardTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::tessellation::anon_unknown_2::test
          (TestStatus *__return_storage_ptr__,anon_unknown_2 *this,Context *context,
          CaseDefinition_conflict caseDef)

{
  pointer *ppfVar1;
  pointer *this_00;
  VkRenderPass VVar2;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkCommandBuffer_s *pVVar3;
  deUint64 dVar4;
  deUint16 dVar5;
  deUint16 dVar6;
  short sVar7;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  RefData<vk::Handle<(vk::HandleType)17>_> data_00;
  RefData<vk::Handle<(vk::HandleType)23>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  deUint32 dVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  deUint32 dVar12;
  deUint32 height;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  VkDeviceSize VVar16;
  Allocation *pAVar17;
  void *pvVar18;
  reference pvVar19;
  reference src;
  VkDeviceMemory memory;
  VkDeviceSize VVar20;
  VkImage *pVVar21;
  Handle<(vk::HandleType)17> *pHVar22;
  Handle<(vk::HandleType)13> *pHVar23;
  Handle<(vk::HandleType)24> *pHVar24;
  GraphicsPipelineBuilder *pGVar25;
  ProgramCollection<vk::ProgramBinary> *pPVar26;
  ProgramBinary *pPVar27;
  Handle<(vk::HandleType)16> *pHVar28;
  VkCommandBuffer_s **ppVVar29;
  Handle<(vk::HandleType)23> *pHVar30;
  Handle<(vk::HandleType)18> *pHVar31;
  VkBuffer *pVVar32;
  size_type sVar33;
  TestContext *this_01;
  TestLog *pTVar34;
  MessageBuilder *pMVar35;
  TessPrimitiveType TVar36;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  char *local_14e8;
  allocator<char> local_1049;
  string local_1048;
  byte local_1023;
  byte local_1022;
  allocator<char> local_1021;
  string local_1020;
  ConstPixelBufferAccess local_1000;
  undefined1 local_fd1;
  undefined1 local_fd0 [7];
  bool ok;
  MessageBuilder local_e50;
  char *local_cd0;
  allocator<char> local_cc1;
  string local_cc0;
  allocator<char> local_c99;
  string local_c98;
  LogImage local_c78;
  MessageBuilder local_be8;
  TestLog *local_a68;
  TestLog *log;
  undefined1 local_a58 [8];
  ConstPixelBufferAccess imagePixelAccess;
  Allocation *colorBufferAlloc;
  undefined1 local_a18 [8];
  VkBufferMemoryBarrier postCopyBarrier;
  undefined1 local_990 [8];
  VkBufferImageCopy copyRegion;
  undefined1 local_938 [8];
  VkImageMemoryBarrier colorAttachmentPreCopyBarrier;
  undefined8 local_8e8;
  VkDeviceSize offsets [2];
  VkBuffer buffers [2];
  undefined1 local_8a8 [8];
  Vec4 clearColor;
  VkRect2D renderArea;
  undefined1 local_868 [8];
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  VkVertexInputAttributeDescription local_770;
  VkVertexInputAttributeDescription local_760;
  VkVertexInputBindingDescription local_750;
  VkVertexInputBindingDescription local_740;
  VkVertexInputBindingDescription local_730;
  VkVertexInputBindingDescription local_720;
  VkVertexInputBindingDescription local_710;
  VkVertexInputBindingDescription local_700;
  GraphicsPipelineBuilder local_6f0;
  Move<vk::Handle<(vk::HandleType)18>_> local_5e8;
  RefData<vk::Handle<(vk::HandleType)18>_> local_5c8;
  undefined1 local_5a8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  undefined1 local_580 [4];
  int inPatchSize;
  RefData<vk::Handle<(vk::HandleType)16>_> local_560;
  undefined1 local_540 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::VkCommandBuffer_s_*> local_518;
  RefData<vk::VkCommandBuffer_s_*> local_4f8;
  undefined1 local_4d8 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_498;
  undefined1 local_478 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)23>_> local_448;
  RefData<vk::Handle<(vk::HandleType)23>_> local_428;
  undefined1 local_408 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_3c8;
  undefined1 local_3a8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  Move<vk::Handle<(vk::HandleType)13>_> local_368;
  RefData<vk::Handle<(vk::HandleType)13>_> local_348;
  undefined1 local_328 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorAttachmentView;
  VkBufferCreateInfo local_300;
  undefined1 local_2c8 [8];
  Buffer colorBuffer;
  VkDeviceSize colorBufferSizeBytes;
  VkImageCreateInfo local_280;
  undefined1 local_228 [8];
  Image colorAttachmentImage;
  VkImageSubresourceRange colorImageSubresourceRange;
  VkFormat colorFormat;
  IVec2 renderSize;
  deUint8 *pData;
  Allocation *alloc;
  VkBufferCreateInfo local_1b8;
  undefined1 local_180 [8];
  Buffer vertexBuffer;
  size_t vertexIndicesOffset;
  size_t vertexTessParamsOffset;
  size_t vertexPositionsOffset;
  VkDeviceSize vertexDataSizeBytes;
  unsigned_short *local_128;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_120;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_118;
  value_type_conflict8 local_10e;
  int local_10c;
  int local_108;
  int n;
  int m;
  int j_2;
  int i_2;
  int k_1;
  int k;
  int secondTriangleVertexIndexOffset;
  deUint16 corners [4];
  int j_1;
  int i_1;
  float local_d8;
  int local_d4;
  int local_d0;
  int j;
  int i;
  undefined4 local_c0;
  undefined4 local_bc;
  int totalNumPosComps;
  int numPosCompsPerVertex;
  int numIndices;
  int numVertices;
  int gridHeight;
  int gridWidth;
  vector<unsigned_short,_std::allocator<unsigned_short>_> gridIndices;
  vector<float,_std::allocator<float>_> gridTessParams;
  vector<float,_std::allocator<float>_> gridPosComps;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  Context *context_local;
  int local_20;
  CaseDefinition_conflict caseDef_local;
  
  TVar36 = caseDef.primitiveType;
  vki = Context::getInstanceInterface((Context *)this);
  physDevice = Context::getPhysicalDevice((Context *)this);
  requireFeatures(vki,physDevice,1);
  vk_00 = Context::getDeviceInterface((Context *)this);
  device_00 = Context::getDevice((Context *)this);
  queue_00 = Context::getUniversalQueue((Context *)this);
  dVar8 = Context::getUniversalQueueFamilyIndex((Context *)this);
  allocator_00 = Context::getDefaultAllocator((Context *)this);
  ppfVar1 = &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)ppfVar1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight);
  numVertices = 4;
  numIndices = 4;
  numPosCompsPerVertex = 0x19;
  local_20 = (int)context;
  totalNumPosComps = (uint)(local_20 == 0) << 5 | 0x40;
  local_bc = 2;
  local_c0 = 0x32;
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)ppfVar1,0x32);
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)
             &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,0x19);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight,
             (long)totalNumPosComps);
  for (local_d0 = 0; local_d0 < 5; local_d0 = local_d0 + 1) {
    for (local_d4 = 0; local_d4 < 5; local_d4 = local_d4 + 1) {
      local_d8 = ((float)local_d4 + 0.5 + (float)local_d4 + 0.5) / 5.0 + -1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_d8);
      i_1 = (int)(((float)local_d0 + 0.5 + (float)local_d0 + 0.5) / 5.0 + -1.0);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&i_1);
      j_1 = (int)((float)(local_d0 * 5 + local_d4) / 24.0);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)
                 &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type_conflict2 *)&j_1);
    }
  }
  if (local_20 == 0) {
    corners[2] = 0;
    corners[3] = 0;
    for (; (int)corners._4_4_ < 4; corners._4_4_ = corners._4_4_ + 1) {
      corners[0] = 0;
      corners[1] = 0;
      for (; (int)corners._0_4_ < 4; corners._0_4_ = corners._0_4_ + 1) {
        dVar6 = (deUint16)corners._4_4_;
        dVar5 = (deUint16)corners._0_4_;
        k._0_2_ = dVar6 * 5 + dVar5;
        k._2_2_ = dVar6 * 5 + dVar5 + 1;
        secondTriangleVertexIndexOffset._0_2_ = (dVar6 + 1) * 5 + dVar5;
        secondTriangleVertexIndexOffset._2_2_ = (dVar6 + 1) * 5 + dVar5 + 1;
        k_1 = (int)(TVar36 != TESSPRIMITIVETYPE_TRIANGLES);
        for (i_2 = 0; i_2 < 3; i_2 = i_2 + 1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight,
                     (value_type_conflict8 *)
                     ((long)&k +
                     (long)(((((int)corners._0_4_ / 3) * 3 - corners._0_4_) + 2 +
                            i_2 + corners._4_4_) % 3) * 2));
        }
        for (j_2 = 0; j_2 < 3; j_2 = j_2 + 1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                    ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight,
                     (value_type_conflict8 *)
                     ((long)&k +
                     (long)((k_1 + 4 +
                            j_2 + corners._4_4_ + (((int)corners._0_4_ / 3) * 3 - corners._0_4_)) %
                            3 + 1) * 2));
        }
      }
    }
  }
  else if (local_20 == 1) {
    for (m = 0; m < 4; m = m + 1) {
      for (n = 0; n < 4; n = n + 1) {
        for (local_108 = 0; local_108 < 2; local_108 = local_108 + 1) {
          for (local_10c = 0; local_10c < 2; local_10c = local_10c + 1) {
            sVar7 = (short)(n + local_10c);
            local_10e = ((short)m + (short)((m + local_108) % 2)) * 5 + (short)n +
                        (sVar7 - (sVar7 - (short)(n + local_10c >> 0x1f) & 0xfffeU));
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight,
                       &local_10e);
          }
        }
        if ((TVar36 == TESSPRIMITIVETYPE_QUADS) && ((m + n) % 2 == 0)) {
          local_120._M_current =
               (unsigned_short *)
               std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight);
          sVar33 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight
                             );
          local_118 = __gnu_cxx::
                      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      ::operator+(&local_120,sVar33 - 4);
          vertexDataSizeBytes =
               (VkDeviceSize)
               std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                         ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight);
          sVar33 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight
                             );
          local_128 = (unsigned_short *)
                      __gnu_cxx::
                      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      ::operator+((__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                                   *)&vertexDataSizeBytes,sVar33);
          std::
          reverse<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                    (local_118,
                     (__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                      )local_128);
        }
      }
    }
  }
  sVar13 = sizeInBytes<float>((vector<float,_std::allocator<float>_> *)
                              &gridTessParams.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar14 = sizeInBytes<float>((vector<float,_std::allocator<float>_> *)
                              &gridIndices.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar15 = sizeInBytes<unsigned_short>
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight);
  VVar16 = sVar13 + sVar14 + sVar15;
  sVar13 = sizeInBytes<float>((vector<float,_std::allocator<float>_> *)
                              &gridTessParams.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  sVar14 = sizeInBytes<float>((vector<float,_std::allocator<float>_> *)
                              &gridIndices.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  vertexBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = sVar13 + sVar14;
  makeBufferCreateInfo(&local_1b8,VVar16,0xc0);
  tessellation::Buffer::Buffer
            ((Buffer *)local_180,vk_00,device_00,allocator_00,&local_1b8,
             ::vk::MemoryRequirement::HostVisible);
  pAVar17 = tessellation::Buffer::getAllocation((Buffer *)local_180);
  pvVar18 = ::vk::Allocation::getHostPtr(pAVar17);
  ppfVar1 = &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)ppfVar1,0);
  sVar14 = sizeInBytes<float>((vector<float,_std::allocator<float>_> *)ppfVar1);
  ::deMemcpy(pvVar18,pvVar19,sVar14);
  this_00 = &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  pvVar19 = std::vector<float,_std::allocator<float>_>::operator[]
                      ((vector<float,_std::allocator<float>_> *)this_00,0);
  sVar14 = sizeInBytes<float>((vector<float,_std::allocator<float>_> *)this_00);
  ::deMemcpy((void *)((long)pvVar18 + sVar13),pvVar19,sVar14);
  pvVar18 = (void *)((long)pvVar18 +
                    vertexBuffer.m_allocation.
                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                    _8_8_);
  src = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight,0);
  sVar14 = sizeInBytes<unsigned_short>
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight);
  ::deMemcpy(pvVar18,src,sVar14);
  memory = ::vk::Allocation::getMemory(pAVar17);
  VVar20 = ::vk::Allocation::getOffset(pAVar17);
  ::vk::flushMappedMemoryRange(vk_00,device_00,memory,VVar20,VVar16);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&colorImageSubresourceRange.layerCount,0x100,0x100);
  colorImageSubresourceRange.baseArrayLayer = 0x25;
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)
             &colorAttachmentImage.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8
             ,1,0,1,0,1);
  makeImageCreateInfo(&local_280,(IVec2 *)&colorImageSubresourceRange.layerCount,
                      VK_FORMAT_R8G8B8A8_UNORM,0x11,1);
  tessellation::Image::Image
            ((Image *)local_228,vk_00,device_00,allocator_00,&local_280,::vk::MemoryRequirement::Any
            );
  iVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  iVar10 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar11 = tcu::getPixelSize((TextureFormat)
                             colorBuffer.m_allocation.
                             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                             m_data._8_8_);
  VVar16 = (VkDeviceSize)(iVar9 * iVar10 * iVar11);
  makeBufferCreateInfo(&local_300,VVar16,2);
  colorAttachmentView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_2c8,vk_00,device_00,allocator_00,&local_300,
             ::vk::MemoryRequirement::HostVisible);
  pVVar21 = tessellation::Image::operator*((Image *)local_228);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_;
  subresourceRange.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange.layerCount = colorImageSubresourceRange.levelCount;
  makeImageView(&local_368,vk_00,device_00,(VkImage)pVVar21->m_internal,VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_348,(Move *)&local_368);
  data.deleter.m_deviceIface._0_4_ = (int)local_348.deleter.m_deviceIface;
  data.object.m_internal = local_348.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_348.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_348.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_348.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_348.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_348.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_328,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_368);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                 &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                  m_allocator,vk_00,device_00,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3c8,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_3c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_3c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_3c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_3c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_3c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_3c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a8);
  VVar2.m_internal = pHVar22->m_internal;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_328);
  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar23->m_internal;
  dVar12 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  makeFramebuffer(&local_448,vk_00,device_00,VVar2,
                  (VkImageView)
                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
                  dVar12,height,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_428,(Move *)&local_448);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_428.deleter.m_deviceIface;
  data_01.object.m_internal = local_428.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_428.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_428.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_428.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_428.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_428.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_408,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_448);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,dVar8);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_498,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_498.deleter.m_deviceIface;
  data_02.object.m_internal = local_498.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_498.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_498.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_498.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_498.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_498.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_478,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_478);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar24->m_internal;
  ::vk::allocateCommandBuffer
            (&local_518,vk_00,device_00,
             (VkCommandPool)
             pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
             m_allocator,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4f8,(Move *)&local_518);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_4f8.deleter.m_deviceIface;
  data_03.object = local_4f8.object;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4f8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_4f8.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_4f8.deleter.m_device >> 0x20);
  data_03.deleter.m_pool.m_internal._0_4_ = (int)local_4f8.deleter.m_pool.m_internal;
  data_03.deleter.m_pool.m_internal._4_4_ = (int)(local_4f8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_4d8,data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_518);
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_580,vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_560,(Move *)local_580);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_560.deleter.m_deviceIface;
  data_04.object.m_internal = local_560.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_560.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_560.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_560.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_560.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_560.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_540,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_580);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator._4_4_ =
       4 - (local_20 == 0);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_6f0);
  pGVar25 = GraphicsPipelineBuilder::setRenderSize
                      (&local_6f0,(IVec2 *)&colorImageSubresourceRange.layerCount);
  pGVar25 = GraphicsPipelineBuilder::setPatchControlPoints
                      (pGVar25,pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.
                               deleter.m_allocator._4_4_);
  local_720 = ::vk::makeVertexInputBindingDescription(0,8,VK_VERTEX_INPUT_RATE_VERTEX);
  local_710 = local_720;
  local_700 = local_720;
  pGVar25 = GraphicsPipelineBuilder::addVertexBinding(pGVar25,local_720);
  local_750 = ::vk::makeVertexInputBindingDescription(1,4,VK_VERTEX_INPUT_RATE_VERTEX);
  local_740 = local_750;
  local_730 = local_750;
  pGVar25 = GraphicsPipelineBuilder::addVertexBinding(pGVar25,local_750);
  local_760 = ::vk::makeVertexInputAttributeDescription(0,0,VK_FORMAT_R32G32_SFLOAT,0);
  pGVar25 = GraphicsPipelineBuilder::addVertexAttribute(pGVar25,local_760);
  local_770 = ::vk::makeVertexInputAttributeDescription(1,1,VK_FORMAT_R32_SFLOAT,0);
  pGVar25 = GraphicsPipelineBuilder::addVertexAttribute(pGVar25,local_770);
  pPVar26 = Context::getBinaryCollection((Context *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"vert",&local_791);
  pPVar27 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar26,&local_790);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar27,
                       (VkSpecializationInfo *)0x0);
  pPVar26 = Context::getBinaryCollection((Context *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"tesc",&local_7b9);
  pPVar27 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar26,&local_7b8);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar27,
                       (VkSpecializationInfo *)0x0);
  pPVar26 = Context::getBinaryCollection((Context *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"tese",&local_7e1);
  pPVar27 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar26,&local_7e0);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar27,
                       (VkSpecializationInfo *)0x0);
  pPVar26 = Context::getBinaryCollection((Context *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_808,"frag",&local_809);
  pPVar27 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar26,&local_808);
  pGVar25 = GraphicsPipelineBuilder::setShader
                      (pGVar25,vk_00,device_00,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar27,
                       (VkSpecializationInfo *)0x0);
  pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_540);
  pipelineLayout_00.m_internal = pHVar28->m_internal;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a8);
  colorAttachmentLayoutBarrier._64_8_ = pHVar22->m_internal;
  GraphicsPipelineBuilder::build
            (&local_5e8,pGVar25,vk_00,device_00,pipelineLayout_00,
             (VkRenderPass)colorAttachmentLayoutBarrier._64_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5c8,(Move *)&local_5e8);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_5c8.deleter.m_deviceIface;
  data_05.object.m_internal = local_5c8.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5c8.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_5c8.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_5c8.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_5c8.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_5c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5a8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_5e8);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_6f0);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  beginCommandBuffer(vk_00,*ppVVar29);
  pVVar21 = tessellation::Image::operator*((Image *)local_228);
  subresourceRange_00.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange_00.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange_00.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_00.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = colorImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_868,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,(VkImage)pVVar21->m_internal,
             subresourceRange_00);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar29,1,0x80,0,0,0,0,0,1,local_868);
  clearColor.m_data._8_8_ = ::vk::makeOffset2D(0,0);
  dVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  dVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  ::vk::makeExtent2D(dVar8,dVar12);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_8a8,0.0,0.0,0.0,1.0);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  commandBuffer = *ppVVar29;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a8);
  VVar2.m_internal = pHVar22->m_internal;
  pHVar30 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_408);
  beginRenderPass(vk_00,commandBuffer,VVar2,(VkFramebuffer)pHVar30->m_internal,
                  (VkRect2D *)(clearColor.m_data + 2),(Vec4 *)local_8a8);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  pVVar3 = *ppVVar29;
  pHVar31 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_5a8);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar3,0,pHVar31->m_internal);
  pVVar32 = tessellation::Buffer::operator*((Buffer *)local_180);
  offsets[1] = pVVar32->m_internal;
  tessellation::Buffer::operator*((Buffer *)local_180);
  local_8e8 = 0;
  offsets[0] = sVar13;
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,*ppVVar29,0,2,offsets + 1,&local_8e8);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  pVVar3 = *ppVVar29;
  pVVar32 = tessellation::Buffer::operator*((Buffer *)local_180);
  colorAttachmentPreCopyBarrier._64_8_ = pVVar32->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x57])
            (vk_00,pVVar3,colorAttachmentPreCopyBarrier._64_8_,
             vertexBuffer.m_allocation.
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_8_,0);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  pVVar3 = *ppVVar29;
  sVar33 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight);
  (*vk_00->_vptr_DeviceInterface[0x5a])(vk_00,pVVar3,sVar33 & 0xffffffff,1,0,0,0);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  endRenderPass(vk_00,*ppVVar29);
  pVVar21 = tessellation::Image::operator*((Image *)local_228);
  copyRegion.imageExtent.height =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  copyRegion.imageExtent.depth =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_01.levelCount = colorImageSubresourceRange.aspectMask;
  subresourceRange_01.aspectMask =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._8_4_;
  subresourceRange_01.baseMipLevel =
       colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_;
  subresourceRange_01.baseArrayLayer = colorImageSubresourceRange.baseMipLevel;
  subresourceRange_01.layerCount = colorImageSubresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_938,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar21->m_internal,subresourceRange_01);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar29,0x400,0x1000,0,0,0,0,0,1,local_938);
  dVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  dVar12 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  extent = ::vk::makeExtent3D(dVar8,dVar12,1);
  subresourceLayers = ::vk::makeImageSubresourceLayers(1,0,0,1);
  makeBufferImageCopy((VkBufferImageCopy *)local_990,extent,subresourceLayers);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  pVVar3 = *ppVVar29;
  pVVar21 = tessellation::Image::operator*((Image *)local_228);
  dVar4 = pVVar21->m_internal;
  pVVar32 = tessellation::Buffer::operator*((Buffer *)local_2c8);
  postCopyBarrier.size = pVVar32->m_internal;
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar3,dVar4,6,postCopyBarrier.size,1,(int)local_990);
  pVVar32 = tessellation::Buffer::operator*((Buffer *)local_2c8);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_a18,0x1000,0x2000,(VkBuffer)pVVar32->m_internal,0,VVar16
            );
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar29,0x1000,0x4000,0,0,0,1,(int)local_a18,0,0);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  endCommandBuffer(vk_00,*ppVVar29);
  ppVVar29 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_4d8);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar29);
  pAVar17 = tessellation::Buffer::getAllocation((Buffer *)local_2c8);
  imagePixelAccess.m_data = (void *)::vk::Allocation::getMemory(pAVar17);
  VVar20 = ::vk::Allocation::getOffset(pAVar17);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,(VkDeviceMemory)imagePixelAccess.m_data,VVar20,VVar16);
  log = (TestLog *)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  iVar10 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageSubresourceRange.layerCount);
  pvVar18 = ::vk::Allocation::getHostPtr(pAVar17);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_a58,(TextureFormat *)&log,iVar9,iVar10,1,pvVar18);
  this_01 = Context::getTestContext((Context *)this);
  pTVar34 = tcu::TestContext::getLog(this_01);
  local_a68 = pTVar34;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c98,"color0",&local_c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_cc0,"Rendered image",&local_cc1);
  tcu::LogImage::LogImage
            (&local_c78,&local_c98,&local_cc0,(ConstPixelBufferAccess *)local_a58,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar34 = tcu::TestLog::operator<<(pTVar34,&local_c78);
  tcu::TestLog::operator<<(&local_be8,pTVar34,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar35 = tcu::MessageBuilder::operator<<
                      (&local_be8,
                       (char (*) [74])
                       "Note: coloring is done to clarify the positioning and orientation of the ");
  if (local_20 == 0) {
    local_14e8 = "triangles";
  }
  else {
    local_14e8 = "";
    if (local_20 == 1) {
      local_14e8 = "quads";
    }
  }
  local_cd0 = local_14e8;
  pMVar35 = tcu::MessageBuilder::operator<<(pMVar35,&local_cd0);
  pMVar35 = tcu::MessageBuilder::operator<<
                      (pMVar35,(char (*) [77])
                               "; the color of a vertex corresponds to the index of that vertex in the patch"
                      );
  tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_be8);
  tcu::LogImage::~LogImage(&local_c78);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::allocator<char>::~allocator(&local_cc1);
  std::__cxx11::string::~string((string *)&local_c98);
  std::allocator<char>::~allocator(&local_c99);
  if (TVar36 == TESSPRIMITIVETYPE_TRIANGLES) {
    tcu::TestLog::operator<<(&local_e50,local_a68,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar35 = tcu::MessageBuilder::operator<<
                        (&local_e50,
                         (char (*) [79])
                         "Note: each shared vertex has the same index among the primitives it belongs to"
                        );
    tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_e50);
  }
  else if (TVar36 == TESSPRIMITIVETYPE_QUADS) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_fd0,local_a68,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar35 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_fd0,
                         (char (*) [73])
                         "Note: the \'precise\' qualifier is used to avoid cracks between primitives"
                        );
    tcu::MessageBuilder::operator<<(pMVar35,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_fd0);
  }
  pTVar34 = local_a68;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_1000,(ConstPixelBufferAccess *)local_a58);
  local_fd1 = verifyResult(pTVar34,&local_1000);
  local_1022 = 0;
  local_1023 = 0;
  if ((bool)local_fd1) {
    std::allocator<char>::allocator();
    local_1022 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1020,"OK",&local_1021);
    local_1023 = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_1020);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1048,"Failure",&local_1049);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_1048);
    std::__cxx11::string::~string((string *)&local_1048);
    std::allocator<char>::~allocator(&local_1049);
  }
  if ((local_1023 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1020);
  }
  if ((local_1022 & 1) != 0) {
    std::allocator<char>::~allocator(&local_1021);
  }
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_540);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_4d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_478);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_408);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_328);
  tessellation::Buffer::~Buffer((Buffer *)local_2c8);
  tessellation::Image::~Image((Image *)local_228);
  tessellation::Buffer::~Buffer((Buffer *)local_180);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&gridHeight);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &gridIndices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)
             &gridTessParams.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDefinition caseDef)
{
	requireFeatures(context.getInstanceInterface(), context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_VERTEX_PIPELINE_STORES_AND_ATOMICS);

	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= context.getDefaultAllocator();

	const std::vector<float>	attributes				= genAttributes(caseDef.useLessThanOneInnerLevels);
	const int					numAttribsPerPrimitive	= 6 + 2 + 2; // Tess levels, scale, offset.
	const int					numPrimitives			= static_cast<int>(attributes.size() / numAttribsPerPrimitive);
	const int					numExpectedVertices		= expectedVertexCount(numPrimitives, numAttribsPerPrimitive, caseDef.primitiveType, caseDef.spacingMode, attributes);

	// Check the convenience assertion that all discarded patches come after the last non-discarded patch.
	{
		bool discardedPatchEncountered = false;
		for (int patchNdx = 0; patchNdx < numPrimitives; ++patchNdx)
		{
			const bool discard = isPatchDiscarded(caseDef.primitiveType, &attributes[numAttribsPerPrimitive*patchNdx + 2]);
			DE_ASSERT(discard || !discardedPatchEncountered);
			discardedPatchEncountered = discard;
		}
		DE_UNREF(discardedPatchEncountered);
	}

	// Vertex input attributes buffer

	const VkFormat	   vertexFormat		   = VK_FORMAT_R32_SFLOAT;
	const deUint32	   vertexStride		   = tcu::getPixelSize(mapVkFormat(vertexFormat));
	const VkDeviceSize vertexDataSizeBytes = sizeInBytes(attributes);
	const Buffer	   vertexBuffer		   (vk, device, allocator, makeBufferCreateInfo(vertexDataSizeBytes, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT), MemoryRequirement::HostVisible);

	DE_ASSERT(static_cast<int>(attributes.size()) == numPrimitives * numAttribsPerPrimitive);
	DE_ASSERT(sizeof(attributes[0]) == vertexStride);

	{
		const Allocation& alloc = vertexBuffer.getAllocation();
		deMemcpy(alloc.getHostPtr(), &attributes[0], static_cast<std::size_t>(vertexDataSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), vertexDataSizeBytes);
		// No barrier needed, flushed memory is automatically visible
	}

	// Output buffer: number of invocations

	const VkDeviceSize resultBufferSizeBytes = sizeof(deInt32);
	const Buffer	   resultBuffer			 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	{
		const Allocation& alloc = resultBuffer.getAllocation();
		deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
		flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
	}

	// Color attachment

	const tcu::IVec2			  renderSize				 = tcu::IVec2(256, 256);
	const VkFormat				  colorFormat				 = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageSubresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Image					  colorAttachmentImage		 (vk, device, allocator,
															 makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, 1u),
															 MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification

	const VkDeviceSize colorBufferSizeBytes = renderSize.x()*renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer colorBuffer(vk, device, allocator,
		makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet    (makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));
	const VkDescriptorBufferInfo  resultBufferInfo = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline

	const Unique<VkImageView>		colorAttachmentView	(makeImageView(vk, device, *colorAttachmentImage, VK_IMAGE_VIEW_TYPE_2D, colorFormat, colorImageSubresourceRange));
	const Unique<VkRenderPass>		renderPass			(makeRenderPass(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer			(makeFramebuffer(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), 1u));
	const Unique<VkPipelineLayout>	pipelineLayout		(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool				(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer			(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const bool						needPointSizeWrite	= getPhysicalDeviceFeatures(context.getInstanceInterface(), context.getPhysicalDevice()).shaderTessellationAndGeometryPointSize && caseDef.usePointMode;

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setRenderSize				  (renderSize)
		.setPatchControlPoints		  (numAttribsPerPrimitive)
		.setVertexInputSingleAttribute(vertexFormat, vertexStride)
		.setShader					  (vk, device, VK_SHADER_STAGE_VERTEX_BIT,					context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, context.getBinaryCollection().get(needPointSizeWrite ? "tese_psw" : "tese"), DE_NULL)
		.setShader					  (vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				context.getBinaryCollection().get("frag"), DE_NULL)
		.build						  (vk, device, *pipelineLayout, *renderPass));

	context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Note: rendering " << numPrimitives << " patches; first patches have valid relevant outer levels, "
		<< "but later patches have one or more invalid (i.e. less than or equal to 0.0) relevant outer levels"
		<< tcu::TestLog::EndMessage;

	// Draw commands

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);
	{
		const VkDeviceSize vertexBufferOffset = 0ull;
		vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &vertexBuffer.get(), &vertexBufferOffset);
	}

	vk.cmdDraw(*cmdBuffer, static_cast<deUint32>(attributes.size()), 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageSubresourceRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkBufferImageCopy copyRegion = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, 1u));
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}
	{
		const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	{
		// Log rendered image
		const Allocation& colorBufferAlloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, colorBufferAlloc.getMemory(), colorBufferAlloc.getOffset(), colorBufferSizeBytes);

		const tcu::ConstPixelBufferAccess imagePixelAccess(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1, colorBufferAlloc.getHostPtr());

		tcu::TestLog& log = context.getTestContext().getLog();
		log << tcu::TestLog::Image("color0", "Rendered image", imagePixelAccess);

		// Verify case result
		const Allocation& resultAlloc = resultBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

		const deInt32 numResultVertices = *static_cast<deInt32*>(resultAlloc.getHostPtr());

		if (!lessThanOneInnerLevelsDefined(caseDef) && caseDef.useLessThanOneInnerLevels)
		{
			// Since we cannot explicitly determine whether or not such interior vertices are going to be
			// generated, we will not verify the number of generated vertices for fractional odd + quads/triangles
			// tessellation configurations.
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices (not verified as number of vertices is implementation-dependent)"
				<< tcu::TestLog::EndMessage;
		}
		else if (numResultVertices < numExpectedVertices)
		{
			log << tcu::TestLog::Message
				<< "Failure: expected " << numExpectedVertices << " vertices from shader invocations, but got only " << numResultVertices
				<< tcu::TestLog::EndMessage;
			return tcu::TestStatus::fail("Wrong number of tessellation coordinates");
		}
		else if (numResultVertices == numExpectedVertices)
		{
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices"
				<< tcu::TestLog::EndMessage;
		}
		else
		{
			log << tcu::TestLog::Message
				<< "Note: shader invocations generated " << numResultVertices << " vertices (expected " << numExpectedVertices << ", got "
				<< (numResultVertices - numExpectedVertices) << " extra)"
				<< tcu::TestLog::EndMessage;
		}

		return (verifyResultImage(log, numPrimitives, numAttribsPerPrimitive, caseDef.primitiveType, attributes, imagePixelAccess)
				? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image verification failed"));
	}
}